

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

void CECoordinates::ICRS2CIRS
               (double input_ra,double input_dec,double *return_ra,double *return_dec,CEDate *date,
               CEAngleType *angle_type)

{
  double tdb2;
  double tdb1;
  double eo;
  double local_98;
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  undefined1 local_28 [8];
  
  local_98 = input_ra;
  if (*angle_type == DEGREES) {
    local_98 = input_ra * 0.017453292519943295;
    input_dec = input_dec * 0.017453292519943295;
  }
  local_68[0] = 0.0;
  local_88[0] = 0.0;
  (*date->_vptr_CEDate[5])(date);
  CEDate::UTC2TDB(local_48,local_68,local_88);
  iauAtci13(local_98,input_dec,0,0,0,0,local_68[0],local_88[0],return_ra,return_dec,local_28);
  if (*angle_type == DEGREES) {
    *return_ra = *return_ra * 57.29577951308232;
    *return_dec = *return_dec * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::ICRS2CIRS(double input_ra, double input_dec,
                              double *return_ra, double *return_dec,
                              const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Store the equation of the origins
    double eo ; // Equation of the origins
    
    // Use the sofa library to convert these coordinates
    try {
        double tdb1(0.0);
        double tdb2(0.0);
        CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
        iauAtci13(input_ra, input_dec, 
                  0.0, 0.0, 0.0, 0.0, 
                  tdb1, tdb2, 
                  return_ra, return_dec, &eo) ;
        
        // Subtract the equation of the origins if J2000 coordinates are desired
        //*return_ra -= eo ;
    } catch (std::exception &e) {
        throw CEException::sofa_exception("CECoordinates::ICRS2CIRS",
                                          "iauAtci13", 
                                          "Exception thrown");
    }
    
    // Convert the returned coordinates to the correct angle type
    if (angle_type == CEAngleType::DEGREES) {
        *return_ra *= DR2D ;
        *return_dec *= DR2D ;
    }
    
    return ;
}